

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void luaO_chunkid(char *out,char *source,size_t bufflen)

{
  long lVar1;
  size_t sVar2;
  char *__s;
  ulong __n;
  
  if (*source != '@') {
    if (*source == '=') {
      strncpy(out,source + 1,bufflen);
      out[bufflen - 1] = '\0';
    }
    else {
      sVar2 = strcspn(source,"\n\r");
      __n = bufflen - 0x11;
      if (sVar2 < bufflen - 0x11) {
        __n = sVar2;
      }
      builtin_strncpy(out,"[string \"",10);
      if (source[__n] == '\0') {
        strcat(out,source);
      }
      else {
        strncat(out,source,__n);
        sVar2 = strlen(out);
        builtin_strncpy(out + sVar2,"...",4);
      }
      sVar2 = strlen(out);
      (out + sVar2)[0] = '\"';
      (out + sVar2)[1] = ']';
      out[sVar2 + 2] = '\0';
    }
    return;
  }
  __s = source + 1;
  sVar2 = strlen(__s);
  *out = '\0';
  lVar1 = sVar2 - (bufflen - 8);
  if (bufflen - 8 <= sVar2 && lVar1 != 0) {
    __s = __s + lVar1;
    sVar2 = strlen(out);
    builtin_strncpy(out + sVar2,"...",4);
  }
  strcat(out,__s);
  return;
}

Assistant:

static void luaO_chunkid(char*out,const char*source,size_t bufflen){
if(*source=='='){
strncpy(out,source+1,bufflen);
out[bufflen-1]='\0';
}
else{
if(*source=='@'){
size_t l;
source++;
bufflen-=sizeof(" '...' ");
l=strlen(source);
strcpy(out,"");
if(l>bufflen){
source+=(l-bufflen);
strcat(out,"...");
}
strcat(out,source);
}
else{
size_t len=strcspn(source,"\n\r");
bufflen-=sizeof(" [string \"...\"] ");
if(len>bufflen)len=bufflen;
strcpy(out,"[string \"");
if(source[len]!='\0'){
strncat(out,source,len);
strcat(out,"...");
}
else
strcat(out,source);
strcat(out,"\"]");
}
}
}